

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

bool __thiscall QHttp2Connection::sendGOAWAY(QHttp2Connection *this,Http2Error errorCode)

{
  QHttp2Connection *this_00;
  QIODevice *pQVar1;
  ssize_t sVar2;
  size_t __n;
  void *__buf;
  
  this_00 = this + 0x250;
  __n = 0;
  Http2::FrameWriter::start((FrameWriter *)this_00,GOAWAY,(FrameFlags)0x0,0);
  Http2::FrameWriter::append<unsigned_int>((FrameWriter *)this_00,*(uint *)(this + 0x2ac));
  Http2::FrameWriter::append<unsigned_int>((FrameWriter *)this_00,errorCode);
  pQVar1 = getSocket(this);
  sVar2 = Http2::FrameWriter::write((FrameWriter *)this_00,(int)pQVar1,__buf,__n);
  return SUB81(sVar2,0);
}

Assistant:

bool QHttp2Connection::sendGOAWAY(Http2::Http2Error errorCode)
{
    frameWriter.start(FrameType::GOAWAY, FrameFlag::EMPTY,
                      Http2PredefinedParameters::connectionStreamID);
    frameWriter.append(quint32(m_lastIncomingStreamID));
    frameWriter.append(quint32(errorCode));
    return frameWriter.write(*getSocket());
}